

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::detail::
make_charset_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,detail *this,
          compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          *chset,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr,
          syntax_option_type flags)

{
  counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pcVar1;
  _WordT *p_Var2;
  detail dVar3;
  ushort uVar4;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar5;
  uint uVar6;
  uint uVar7;
  _WordT _Var8;
  long lVar9;
  dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pdVar10;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iVar15;
  long lVar16;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  xpr;
  charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  matcher;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  local_68;
  
  if (((ulong)tr & 8) == 0) {
    if (*(long *)this == 0) {
      uVar12 = 0xffffffffffffffff;
      do {
        if (uVar12 == 2) {
          uVar13 = 3;
          break;
        }
        uVar13 = uVar12 + 1;
        lVar9 = uVar12 * 8;
        uVar12 = uVar13;
      } while (*(long *)(this + lVar9 + 0x10) == 0);
      if ((2 < uVar13) && (*(long *)(this + 0x28) == *(long *)(this + 0x30))) {
        dVar3 = this[0x20];
        uVar4 = *(ushort *)(this + 0x22);
        pdVar10 = (dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)operator_new(0x18);
        *(uint *)&(pdVar10->
                  super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).field_0xc = (uint)uVar4 << 0x10 | (uint)(byte)dVar3;
        (pdVar10->
        super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .count_.value_ = 0;
        (pdVar10->
        super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._vptr_matchable = (_func_int **)&PTR__dynamic_xpression_00196e80;
        psVar11 = get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            ();
        pmVar5 = (psVar11->xpr_).px;
        (pdVar10->
        super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
        ).charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
        super__Base_bitset<4UL>._M_w[0] = (_WordT)pmVar5;
        if (pmVar5 != (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0) {
          LOCK();
          (pmVar5->
          super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ).count_.value_ =
               (pmVar5->
               super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ).count_.value_ + 1;
          UNLOCK();
        }
        LOCK();
        pcVar1 = &(pdVar10->
                  super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).
                  super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ;
        (pcVar1->count_).value_ = (pcVar1->count_).value_ + 1;
        UNLOCK();
        local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
        super__Base_bitset<4UL>._M_w[0] = (_WordT)pdVar10;
        sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
        sequence<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
                  ((sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_68);
        iVar15.px = (dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                       super__Base_bitset<4UL>._M_w[0];
        goto LAB_00139932;
      }
    }
    if (((ulong)tr & 2) == 0) {
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[0] = *(_WordT *)this;
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[1] = *(_WordT *)(this + 8);
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[2] = *(_WordT *)(this + 0x10);
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[3] = *(_WordT *)(this + 0x18);
      local_68.charset_._32_4_ = *(undefined4 *)(this + 0x20);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&local_68.charset_.posix_no_,
                 (vector<unsigned_short,_std::allocator<unsigned_short>_> *)(this + 0x28));
      pdVar10 = (dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)operator_new(0x58);
      dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::dynamic_xpression(pdVar10,&local_68);
      LOCK();
      pcVar1 = &(pdVar10->
                super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      (pcVar1->count_).value_ = (pcVar1->count_).value_ + 1;
      UNLOCK();
      local_70.px = pdVar10;
      sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
      sequence<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>>
                ((sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_70);
    }
    else {
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[0] = *(_WordT *)this;
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[1] = *(_WordT *)(this + 8);
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[2] = *(_WordT *)(this + 0x10);
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[3] = *(_WordT *)(this + 0x18);
      local_68.charset_._32_4_ = *(undefined4 *)(this + 0x20);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&local_68.charset_.posix_no_,
                 (vector<unsigned_short,_std::allocator<unsigned_short>_> *)(this + 0x28));
      pdVar10 = (dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)operator_new(0x58);
      dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::dynamic_xpression((dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)pdVar10,
                          (charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                           *)&local_68);
      LOCK();
      pcVar1 = &(pdVar10->
                super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      (pcVar1->count_).value_ = (pcVar1->count_).value_ + 1;
      UNLOCK();
      local_70.px = pdVar10;
      sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
      sequence<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>>
                ((sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_70);
    }
    if (local_70.px !=
        (dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LOCK();
      pcVar1 = &((local_70.px)->
                super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      (pcVar1->count_).value_ = (pcVar1->count_).value_ + -1;
      UNLOCK();
      if ((pcVar1->count_).value_ == 0) {
        (*((local_70.px)->
          super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._vptr_matchable[1])();
      }
    }
    if (local_68.charset_.posix_no_.
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.charset_.posix_no_.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    if (((ulong)tr & 2) == 0) {
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[2] = *(_WordT *)(this + 0x10);
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[3] = *(_WordT *)(this + 0x18);
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[0] =
           (_WordT)*(dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     **)this;
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[1] = *(_WordT *)(this + 8);
      uVar4 = *(ushort *)(this + 0x22);
      if (uVar4 != 0) {
        uVar12 = 0;
        do {
          if ((*(ushort *)
                ((long)(chset->super_basic_chset<char>).super_basic_chset_8bit<char>.bset_.
                       super__Base_bitset<4UL>._M_w + uVar12 * 2) & uVar4) != 0) {
            p_Var2 = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                     super__Base_bitset<4UL>._M_w + (uVar12 >> 6);
            *p_Var2 = *p_Var2 | 1L << ((byte)uVar12 & 0x3f);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != 0x100);
      }
      lVar9 = *(long *)(this + 0x28);
      if (lVar9 != *(long *)(this + 0x30)) {
        lVar14 = *(long *)(this + 0x30) - lVar9 >> 1;
        lVar16 = 0;
        do {
          uVar4 = *(ushort *)(lVar9 + lVar16 * 2);
          uVar12 = 0;
          do {
            if ((*(ushort *)
                  ((long)(chset->super_basic_chset<char>).super_basic_chset_8bit<char>.bset_.
                         super__Base_bitset<4UL>._M_w + uVar12 * 2) & uVar4) == 0) {
              p_Var2 = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                       super__Base_bitset<4UL>._M_w + (uVar12 >> 6);
              *p_Var2 = *p_Var2 | 1L << ((byte)uVar12 & 0x3f);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != 0x100);
          lVar16 = lVar16 + 1;
        } while (lVar16 != lVar14 + (ulong)(lVar14 == 0));
      }
      if (this[0x20] == (detail)0x1) {
        lVar9 = 0;
        do {
          uVar6 = *(uint *)((long)local_68.charset_.super_basic_chset<char>.
                                  super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>._M_w +
                           lVar9 * 8 + 4);
          _Var8 = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                  super__Base_bitset<4UL>._M_w[lVar9 + 1];
          uVar7 = *(uint *)((long)local_68.charset_.super_basic_chset<char>.
                                  super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>._M_w +
                           lVar9 * 8 + 0xc);
          *(uint *)(local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                    super__Base_bitset<4UL>._M_w + lVar9) =
               (uint)local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                     super__Base_bitset<4UL>._M_w[lVar9] ^ 0xffffffff;
          *(uint *)((long)local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.
                          bset_.super__Base_bitset<4UL>._M_w + lVar9 * 8 + 4) = uVar6 ^ 0xffffffff;
          *(uint *)(local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                    super__Base_bitset<4UL>._M_w + lVar9 + 1) = (uint)_Var8 ^ 0xffffffff;
          *(uint *)((long)local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.
                          bset_.super__Base_bitset<4UL>._M_w + lVar9 * 8 + 0xc) = uVar7 ^ 0xffffffff
          ;
          lVar9 = lVar9 + 2;
        } while (lVar9 != 4);
      }
      pdVar10 = (dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)operator_new(0x38);
      (pdVar10->
      super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
      ).charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>.
      _M_w[0] = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                super__Base_bitset<4UL>._M_w[0];
      (pdVar10->
      super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
      ).charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>.
      _M_w[1] = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                super__Base_bitset<4UL>._M_w[1];
      (pdVar10->
      super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
      ).charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>.
      _M_w[2] = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                super__Base_bitset<4UL>._M_w[2];
      (pdVar10->
      super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
      ).charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>.
      _M_w[3] = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                super__Base_bitset<4UL>._M_w[3];
      (pdVar10->
      super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .count_.value_ = 0;
      (pdVar10->
      super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._vptr_matchable = (_func_int **)&PTR__dynamic_xpression_001974b0;
      psVar11 = get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          ();
      pmVar5 = (psVar11->xpr_).px;
      *(matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        **)&(pdVar10->
            super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
            ).charset_.complement_ = pmVar5;
      if (pmVar5 != (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0) {
        LOCK();
        (pmVar5->
        super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ).count_.value_ =
             (pmVar5->
             super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ).count_.value_ + 1;
        UNLOCK();
      }
      LOCK();
      pcVar1 = &(pdVar10->
                super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      (pcVar1->count_).value_ = (pcVar1->count_).value_ + 1;
      UNLOCK();
      local_70.px = pdVar10;
      sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
      sequence<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,boost::xpressive::detail::basic_chset<char>>>
                ((sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::basic_chset<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_70);
      iVar15.px = local_70.px;
    }
    else {
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[2] = *(_WordT *)(this + 0x10);
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[3] = *(_WordT *)(this + 0x18);
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[0] =
           (_WordT)*(dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     **)this;
      local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
      super__Base_bitset<4UL>._M_w[1] = *(_WordT *)(this + 8);
      uVar4 = *(ushort *)(this + 0x22);
      if (uVar4 != 0) {
        uVar12 = 0;
        do {
          if ((*(ushort *)
                ((long)(chset->super_basic_chset<char>).super_basic_chset_8bit<char>.bset_.
                       super__Base_bitset<4UL>._M_w + uVar12 * 2) & uVar4) != 0) {
            p_Var2 = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                     super__Base_bitset<4UL>._M_w + (uVar12 >> 6);
            *p_Var2 = *p_Var2 | 1L << ((byte)uVar12 & 0x3f);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != 0x100);
      }
      lVar9 = *(long *)(this + 0x28);
      if (lVar9 != *(long *)(this + 0x30)) {
        lVar14 = *(long *)(this + 0x30) - lVar9 >> 1;
        lVar16 = 0;
        do {
          uVar4 = *(ushort *)(lVar9 + lVar16 * 2);
          uVar12 = 0;
          do {
            if ((*(ushort *)
                  ((long)(chset->super_basic_chset<char>).super_basic_chset_8bit<char>.bset_.
                         super__Base_bitset<4UL>._M_w + uVar12 * 2) & uVar4) == 0) {
              p_Var2 = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                       super__Base_bitset<4UL>._M_w + (uVar12 >> 6);
              *p_Var2 = *p_Var2 | 1L << ((byte)uVar12 & 0x3f);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != 0x100);
          lVar16 = lVar16 + 1;
        } while (lVar16 != lVar14 + (ulong)(lVar14 == 0));
      }
      if (this[0x20] == (detail)0x1) {
        lVar9 = 0;
        do {
          uVar6 = *(uint *)((long)local_68.charset_.super_basic_chset<char>.
                                  super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>._M_w +
                           lVar9 * 8 + 4);
          _Var8 = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                  super__Base_bitset<4UL>._M_w[lVar9 + 1];
          uVar7 = *(uint *)((long)local_68.charset_.super_basic_chset<char>.
                                  super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>._M_w +
                           lVar9 * 8 + 0xc);
          *(uint *)(local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                    super__Base_bitset<4UL>._M_w + lVar9) =
               (uint)local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                     super__Base_bitset<4UL>._M_w[lVar9] ^ 0xffffffff;
          *(uint *)((long)local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.
                          bset_.super__Base_bitset<4UL>._M_w + lVar9 * 8 + 4) = uVar6 ^ 0xffffffff;
          *(uint *)(local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                    super__Base_bitset<4UL>._M_w + lVar9 + 1) = (uint)_Var8 ^ 0xffffffff;
          *(uint *)((long)local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.
                          bset_.super__Base_bitset<4UL>._M_w + lVar9 * 8 + 0xc) = uVar7 ^ 0xffffffff
          ;
          lVar9 = lVar9 + 2;
        } while (lVar9 != 4);
      }
      pdVar10 = (dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)operator_new(0x38);
      (pdVar10->
      super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
      ).charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>.
      _M_w[0] = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                super__Base_bitset<4UL>._M_w[0];
      (pdVar10->
      super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
      ).charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>.
      _M_w[1] = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                super__Base_bitset<4UL>._M_w[1];
      (pdVar10->
      super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
      ).charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>.
      _M_w[2] = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                super__Base_bitset<4UL>._M_w[2];
      (pdVar10->
      super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
      ).charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.super__Base_bitset<4UL>.
      _M_w[3] = local_68.charset_.super_basic_chset<char>.super_basic_chset_8bit<char>.bset_.
                super__Base_bitset<4UL>._M_w[3];
      (pdVar10->
      super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .count_.value_ = 0;
      (pdVar10->
      super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._vptr_matchable = (_func_int **)&PTR__dynamic_xpression_00197300;
      psVar11 = get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          ();
      pmVar5 = (psVar11->xpr_).px;
      *(matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        **)&(pdVar10->
            super_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
            ).charset_.complement_ = pmVar5;
      if (pmVar5 != (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0) {
        LOCK();
        (pmVar5->
        super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ).count_.value_ =
             (pmVar5->
             super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ).count_.value_ + 1;
        UNLOCK();
      }
      LOCK();
      pcVar1 = &(pdVar10->
                super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      (pcVar1->count_).value_ = (pcVar1->count_).value_ + 1;
      UNLOCK();
      local_70.px = pdVar10;
      sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
      sequence<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::basic_chset<char>>>
                ((sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::basic_chset<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_70);
      iVar15.px = local_70.px;
    }
LAB_00139932:
    if (iVar15.px !=
        (dynamic_xpression<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LOCK();
      pcVar1 = &((iVar15.px)->
                super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      (pcVar1->count_).value_ = (pcVar1->count_).value_ + -1;
      UNLOCK();
      if ((pcVar1->count_).value_ == 0) {
        (*((iVar15.px)->
          super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._vptr_matchable[1])();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline sequence<BidiIter> make_charset_xpression
(
    compound_charset<Traits> &chset
  , Traits const &tr
  , regex_constants::syntax_option_type flags
)
{
    typedef typename Traits::char_type char_type;
    bool const icase = (0 != (regex_constants::icase_ & flags));
    bool const optimize = is_narrow_char<char_type>::value && 0 != (regex_constants::optimize & flags);

    // don't care about compile speed -- fold eveything into a bitset<256>
    if(optimize)
    {
        typedef basic_chset<char_type> charset_type;
        charset_type charset(chset.base());
        if(icase)
        {
            charset_matcher<Traits, mpl::true_, charset_type> matcher(charset);
            merge_charset(matcher.charset_, chset, tr);
            return make_dynamic<BidiIter>(matcher);
        }
        else
        {
            charset_matcher<Traits, mpl::false_, charset_type> matcher(charset);
            merge_charset(matcher.charset_, chset, tr);
            return make_dynamic<BidiIter>(matcher);
        }
    }

    // special case to make [[:digit:]] fast
    else if(chset.base().empty() && chset.posix_no().empty())
    {
        BOOST_ASSERT(0 != chset.posix_yes());
        posix_charset_matcher<Traits> matcher(chset.posix_yes(), chset.is_inverted());
        return make_dynamic<BidiIter>(matcher);
    }

    // default, slow
    else
    {
        if(icase)
        {
            charset_matcher<Traits, mpl::true_> matcher(chset);
            return make_dynamic<BidiIter>(matcher);
        }
        else
        {
            charset_matcher<Traits, mpl::false_> matcher(chset);
            return make_dynamic<BidiIter>(matcher);
        }
    }
}